

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitExport(PrintSExpression *this,Export *curr)

{
  ostream *poVar1;
  ostream *in_RCX;
  uint *puVar2;
  char *pcVar3;
  Name name;
  
  std::operator<<(this->o,'(');
  printMedium(this->o,"export ");
  poVar1 = printText(this->o,(curr->name).super_IString.str._M_str);
  std::operator<<(poVar1," (");
  puVar2 = &switchD_0092460f::switchdataD_00bbf388;
  switch(curr->kind) {
  case Function:
    pcVar3 = "func";
    break;
  case Table:
    pcVar3 = "table";
    break;
  case Memory:
    pcVar3 = "memory";
    break;
  case Global:
    pcVar3 = "global";
    break;
  case Tag:
    pcVar3 = "tag";
    break;
  case Invalid:
    handle_unreachable("invalid ExternalKind",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                       ,0xbfe);
  default:
    goto switchD_0092460f_default;
  }
  std::operator<<(this->o,pcVar3);
  in_RCX = (ostream *)puVar2;
switchD_0092460f_default:
  std::operator<<(this->o,' ');
  poVar1 = this->o;
  name.super_IString.str._M_str = (char *)poVar1;
  name.super_IString.str._M_len = (size_t)(curr->value).super_IString.str._M_str;
  anon_unknown_217::printName
            ((anon_unknown_217 *)(curr->value).super_IString.str._M_len,name,in_RCX);
  std::operator<<(poVar1,"))");
  return;
}

Assistant:

void visitExport(Export* curr) {
    o << '(';
    printMedium(o, "export ");
    // TODO: Escape the string properly.
    printText(o, curr->name.str.data()) << " (";
    switch (curr->kind) {
      case ExternalKind::Function:
        o << "func";
        break;
      case ExternalKind::Table:
        o << "table";
        break;
      case ExternalKind::Memory:
        o << "memory";
        break;
      case ExternalKind::Global:
        o << "global";
        break;
      case ExternalKind::Tag:
        o << "tag";
        break;
      case ExternalKind::Invalid:
        WASM_UNREACHABLE("invalid ExternalKind");
    }
    o << ' ';
    printName(curr->value, o) << "))";
  }